

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O3

int testValid_Pipeline(void)

{
  RepeatedField<long> *this;
  int iVar1;
  ulong uVar2;
  bool bVar3;
  Pipeline *pPVar4;
  Model *pMVar5;
  Model *pMVar6;
  Model *pMVar7;
  Rep *pRVar8;
  Model *pMVar9;
  NeuralNetwork *nn;
  ostream *poVar10;
  NetworkUpdateParameters *pNVar11;
  LossLayer *pLVar12;
  CategoricalCrossEntropyLossLayer *pCVar13;
  ModelDescription *pMVar14;
  FeatureDescription *obj;
  void *pvVar15;
  FeatureType *this_00;
  ArrayFeatureType *pAVar16;
  long *plVar17;
  undefined8 *puVar18;
  uint uVar19;
  Arena *pAVar20;
  RepeatedPtrField<CoreML::Specification::Model> *this_01;
  Result res;
  string targetName;
  string softmaxOutputName;
  TensorAttributes tensorAttributesD;
  TensorAttributes tensorAttributesC;
  TensorAttributes tensorAttributesB;
  TensorAttributes tensorAttributesA;
  Model spec;
  undefined1 local_1c8 [8];
  _Alloc_hider local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  undefined1 local_1a0 [8];
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  long *local_178 [2];
  long local_168 [2];
  long *local_158 [2];
  long local_148 [2];
  TensorAttributes local_138;
  TensorAttributes local_128;
  TensorAttributes local_118;
  TensorAttributes local_108;
  Model local_f8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_c8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_98;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_68;
  
  CoreML::Specification::Model::Model(&local_f8,(Arena *)0x0,false);
  CoreML::Result::Result((Result *)local_1a0);
  local_108.name = "A";
  local_108.dimension = 3;
  local_108._12_4_ = 0;
  local_118.name = "B";
  local_118.dimension = 1;
  local_118._12_4_ = 0;
  local_128.name = "C";
  local_128.dimension = 1;
  local_128._12_4_ = 0;
  local_138.name = "D";
  local_138.dimension = 3;
  local_138._12_4_ = 0;
  pPVar4 = buildEmptyPipelineModelWithStringOutput(&local_f8,true,&local_108,"E");
  local_f8.specificationversion_ = 4;
  this_01 = &pPVar4->models_;
  pRVar8 = (pPVar4->models_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar8 == (Rep *)0x0) {
LAB_001bd557:
    pMVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Model>
                       ((this_01->super_RepeatedPtrFieldBase).arena_);
    pMVar5 = (Model *)google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                (&this_01->super_RepeatedPtrFieldBase,pMVar5);
    pRVar8 = (pPVar4->models_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar8 != (Rep *)0x0) goto LAB_001bd576;
LAB_001bd58c:
    pMVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Model>
                       ((this_01->super_RepeatedPtrFieldBase).arena_);
    pMVar6 = (Model *)google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                (&this_01->super_RepeatedPtrFieldBase,pMVar6);
    pRVar8 = (pPVar4->models_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar8 != (Rep *)0x0) goto LAB_001bd5ab;
LAB_001bd5c1:
    pMVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Model>
                       ((this_01->super_RepeatedPtrFieldBase).arena_);
    pMVar7 = (Model *)google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                (&this_01->super_RepeatedPtrFieldBase,pMVar7);
    pRVar8 = (pPVar4->models_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar8 != (Rep *)0x0) goto LAB_001bd5e0;
LAB_001bd5f6:
    pMVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Model>
                       ((this_01->super_RepeatedPtrFieldBase).arena_);
    pMVar9 = (Model *)google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                (&this_01->super_RepeatedPtrFieldBase,pMVar9);
  }
  else {
    iVar1 = (pPVar4->models_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar8->allocated_size <= iVar1) goto LAB_001bd557;
    (pPVar4->models_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pMVar5 = (Model *)pRVar8->elements[iVar1];
LAB_001bd576:
    iVar1 = (pPVar4->models_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar8->allocated_size <= iVar1) goto LAB_001bd58c;
    (pPVar4->models_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pMVar6 = (Model *)pRVar8->elements[iVar1];
LAB_001bd5ab:
    iVar1 = (pPVar4->models_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar8->allocated_size <= iVar1) goto LAB_001bd5c1;
    (pPVar4->models_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pMVar7 = (Model *)pRVar8->elements[iVar1];
LAB_001bd5e0:
    iVar1 = (pPVar4->models_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar8->allocated_size <= iVar1) goto LAB_001bd5f6;
    (pPVar4->models_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pMVar9 = (Model *)pRVar8->elements[iVar1];
  }
  buildBasicNeuralNetworkModel(pMVar5,false,&local_108,&local_118,1,false,false);
  buildBasicNeuralNetworkModel(pMVar6,false,&local_118,&local_128,1,false,false);
  nn = buildBasicNeuralNetworkModel(pMVar7,true,&local_128,&local_138,1,false,false);
  buildBasicNearestNeighborClassifier(pMVar9,false,&local_138,"E");
  CoreML::Model::validate((Result *)local_1c8,pMVar5);
  local_1a0 = local_1c8;
  std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_p != &local_1b0) {
    operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
  }
  bVar3 = CoreML::Result::good((Result *)local_1a0);
  if (bVar3) {
    CoreML::Model::validate((Result *)local_1c8,pMVar6);
    local_1a0 = local_1c8;
    std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_p != &local_1b0) {
      operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
    }
    bVar3 = CoreML::Result::good((Result *)local_1a0);
    if (bVar3) {
      CoreML::Model::validate((Result *)local_1c8,pMVar7);
      local_1a0 = local_1c8;
      std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_p != &local_1b0) {
        operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
      }
      bVar3 = CoreML::Result::good((Result *)local_1a0);
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                   ,0x74);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x987);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res).good())",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      }
      else {
        CoreML::Model::validate((Result *)local_1c8,pMVar9);
        local_1a0 = local_1c8;
        std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_p != &local_1b0) {
          operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
        }
        bVar3 = CoreML::Result::good((Result *)local_1a0);
        if (bVar3) {
          CoreML::Model::validate((Result *)local_1c8,&local_f8);
          local_1a0 = local_1c8;
          std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_p != &local_1b0) {
            operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
          }
          bVar3 = CoreML::Result::good((Result *)local_1a0);
          if (!bVar3) {
            local_158[0] = local_148;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"softmax_out","");
            local_178[0] = local_168;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"cce_target","");
            addSoftmaxLayer(pMVar7,"softmax",local_138.name,(char *)local_158[0]);
            pNVar11 = nn->updateparams_;
            if (pNVar11 == (NetworkUpdateParameters *)0x0) {
              uVar2 = (nn->super_MessageLite)._internal_metadata_.ptr_;
              pAVar20 = (Arena *)(uVar2 & 0xfffffffffffffffc);
              if ((uVar2 & 1) != 0) {
                pAVar20 = *(Arena **)pAVar20;
              }
              pNVar11 = google::protobuf::Arena::
                        CreateMaybeMessage<CoreML::Specification::NetworkUpdateParameters>(pAVar20);
              nn->updateparams_ = pNVar11;
            }
            pRVar8 = (pNVar11->losslayers_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar8 == (Rep *)0x0) {
LAB_001bdc4f:
              pLVar12 = google::protobuf::Arena::
                        CreateMaybeMessage<CoreML::Specification::LossLayer>
                                  ((pNVar11->losslayers_).super_RepeatedPtrFieldBase.arena_);
              pLVar12 = (LossLayer *)
                        google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                  (&(pNVar11->losslayers_).super_RepeatedPtrFieldBase,pLVar12);
            }
            else {
              iVar1 = (pNVar11->losslayers_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar8->allocated_size <= iVar1) goto LAB_001bdc4f;
              (pNVar11->losslayers_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
              pLVar12 = (LossLayer *)pRVar8->elements[iVar1];
            }
            uVar2 = (pLVar12->super_MessageLite)._internal_metadata_.ptr_;
            puVar18 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
            if ((uVar2 & 1) != 0) {
              puVar18 = (undefined8 *)*puVar18;
            }
            google::protobuf::internal::ArenaStringPtr::
            Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                      (&pLVar12->name_,"cce_loss",puVar18);
            if (pLVar12->_oneof_case_[0] == 10) {
              pCVar13 = (pLVar12->LossLayerType_).categoricalcrossentropylosslayer_;
            }
            else {
              CoreML::Specification::LossLayer::clear_LossLayerType(pLVar12);
              pLVar12->_oneof_case_[0] = 10;
              uVar2 = (pLVar12->super_MessageLite)._internal_metadata_.ptr_;
              pAVar20 = (Arena *)(uVar2 & 0xfffffffffffffffc);
              if ((uVar2 & 1) != 0) {
                pAVar20 = *(Arena **)pAVar20;
              }
              pCVar13 = google::protobuf::Arena::
                        CreateMaybeMessage<CoreML::Specification::CategoricalCrossEntropyLossLayer>
                                  (pAVar20);
              (pLVar12->LossLayerType_).categoricalcrossentropylosslayer_ = pCVar13;
            }
            uVar2 = (pCVar13->super_MessageLite)._internal_metadata_.ptr_;
            puVar18 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
            if ((uVar2 & 1) != 0) {
              puVar18 = (undefined8 *)*puVar18;
            }
            google::protobuf::internal::ArenaStringPtr::Set(&pCVar13->input_,local_158,puVar18);
            uVar2 = (pCVar13->super_MessageLite)._internal_metadata_.ptr_;
            puVar18 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
            if ((uVar2 & 1) != 0) {
              puVar18 = (undefined8 *)*puVar18;
            }
            google::protobuf::internal::ArenaStringPtr::Set(&pCVar13->target_,local_178,puVar18);
            pMVar14 = pMVar7->description_;
            if (pMVar14 == (ModelDescription *)0x0) {
              uVar2 = (pMVar7->super_MessageLite)._internal_metadata_.ptr_;
              pAVar20 = (Arena *)(uVar2 & 0xfffffffffffffffc);
              if ((uVar2 & 1) != 0) {
                pAVar20 = *(Arena **)pAVar20;
              }
              pMVar14 = google::protobuf::Arena::
                        CreateMaybeMessage<CoreML::Specification::ModelDescription>(pAVar20);
              pMVar7->description_ = pMVar14;
            }
            pRVar8 = (pMVar14->traininginput_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar8 == (Rep *)0x0) {
LAB_001bdd65:
              obj = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                              ((pMVar14->traininginput_).super_RepeatedPtrFieldBase.arena_);
              pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                  (&(pMVar14->traininginput_).super_RepeatedPtrFieldBase,obj);
            }
            else {
              iVar1 = (pMVar14->traininginput_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar8->allocated_size <= iVar1) goto LAB_001bdd65;
              (pMVar14->traininginput_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
              pvVar15 = pRVar8->elements[iVar1];
            }
            puVar18 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
            if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
              puVar18 = (undefined8 *)*puVar18;
            }
            google::protobuf::internal::ArenaStringPtr::Set
                      ((ArenaStringPtr *)((long)pvVar15 + 0x10),local_178,puVar18);
            this_00 = *(FeatureType **)((long)pvVar15 + 0x20);
            if (this_00 == (FeatureType *)0x0) {
              pAVar20 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
              if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
                pAVar20 = *(Arena **)pAVar20;
              }
              this_00 = google::protobuf::Arena::
                        CreateMaybeMessage<CoreML::Specification::FeatureType>(pAVar20);
              *(FeatureType **)((long)pvVar15 + 0x20) = this_00;
            }
            if (this_00->_oneof_case_[0] == 5) {
              pAVar16 = (this_00->Type_).multiarraytype_;
            }
            else {
              CoreML::Specification::FeatureType::clear_Type(this_00);
              this_00->_oneof_case_[0] = 5;
              uVar2 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
              pAVar20 = (Arena *)(uVar2 & 0xfffffffffffffffc);
              if ((uVar2 & 1) != 0) {
                pAVar20 = *(Arena **)pAVar20;
              }
              pAVar16 = google::protobuf::Arena::
                        CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>(pAVar20);
              (this_00->Type_).multiarraytype_ = pAVar16;
            }
            pAVar16->datatype_ = 0x20020;
            this = &pAVar16->shape_;
            uVar19 = (pAVar16->shape_).current_size_;
            if (uVar19 == (pAVar16->shape_).total_size_) {
              google::protobuf::RepeatedField<long>::Reserve(this,uVar19 + 1);
              plVar17 = google::protobuf::RepeatedField<long>::elements(this);
              plVar17[uVar19] = 1;
            }
            else {
              plVar17 = google::protobuf::RepeatedField<long>::elements(this);
              plVar17[uVar19] = 1;
            }
            this->current_size_ = uVar19 + 1;
            addLearningRate<CoreML::Specification::NeuralNetwork>
                      (nn,kSgdOptimizer,0.699999988079071,0.0,1.0);
            local_68._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_68._M_impl.super__Rb_tree_header._M_header;
            local_68._M_impl._0_8_ = 0;
            local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_68._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_68._M_impl.super__Rb_tree_header._M_header._M_left;
            addMiniBatchSize<CoreML::Specification::NeuralNetwork>
                      (nn,kSgdOptimizer,10,5,100,
                       (set<long,_std::less<long>,_std::allocator<long>_> *)&local_68);
            std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
            ::~_Rb_tree(&local_68);
            local_98._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_98._M_impl.super__Rb_tree_header._M_header;
            local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_98._M_impl._0_8_ = 0;
            local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_98._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_98._M_impl.super__Rb_tree_header._M_header._M_left;
            addEpochs<CoreML::Specification::NeuralNetwork>
                      (nn,100,1,100,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_98);
            std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
            ::~_Rb_tree(&local_98);
            local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_c8._M_impl.super__Rb_tree_header._M_header;
            local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_c8._M_impl._0_8_ = 0;
            local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_c8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
            addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
                      (nn,0x7e3,0,0x7e3,
                       (set<long,_std::less<long>,_std::allocator<long>_> *)&local_c8);
            std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
            ::~_Rb_tree(&local_c8);
            CoreML::Model::validate((Result *)local_1c8,pMVar7);
            local_1a0 = local_1c8;
            std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_p != &local_1b0) {
              operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
            }
            bVar3 = CoreML::Result::good((Result *)local_1a0);
            if (!bVar3) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                         ,0x74);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x9a9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(res).good()",0xc);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10," was false, expected true.",0x1a);
              std::endl<char,std::char_traits<char>>(poVar10);
            }
            uVar19 = (uint)!bVar3;
            if (local_178[0] != local_168) {
              operator_delete(local_178[0],local_168[0] + 1);
            }
            if (local_158[0] != local_148) {
              operator_delete(local_158[0],local_148[0] + 1);
            }
            goto LAB_001bd97e;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                     ,0x74);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x98e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res).good())",0xf);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                     ,0x74);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x98a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(res).good()",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        }
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                 ,0x74);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x984);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(res).good()",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x74);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x981);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  }
  std::ostream::put((char)poVar10);
  uVar19 = 1;
  std::ostream::flush();
LAB_001bd97e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_p != &local_188) {
    operator_delete(local_198._M_p,local_188._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_f8);
  return uVar19;
}

Assistant:

int testValid_Pipeline() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesA = { "A", 3 };
    TensorAttributes tensorAttributesB = { "B", 1 };
    TensorAttributes tensorAttributesC = { "C", 1 };
    TensorAttributes tensorAttributesD = { "D", 3 };

    auto pipeline = buildEmptyPipelineModelWithStringOutput(spec, true, &tensorAttributesA, "E");
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    auto m1 = pipeline->add_models();
    auto m2 = pipeline->add_models();
    auto m3 = pipeline->add_models();
    auto m4 = pipeline->add_models();

    (void)buildBasicNeuralNetworkModel(*m1, false, &tensorAttributesA, &tensorAttributesB);
    (void)buildBasicNeuralNetworkModel(*m2, false, &tensorAttributesB, &tensorAttributesC);
    auto neuralNet = buildBasicNeuralNetworkModel(*m3, true, &tensorAttributesC, &tensorAttributesD);
    (void)buildBasicNearestNeighborClassifier(*m4, false, &tensorAttributesD, "E");

    res = Model::validate(*m1);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m2);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m3);
    ML_ASSERT_BAD(res);

    res = Model::validate(*m4);
    ML_ASSERT_GOOD(res);

    // expect validation to pass!
    res = Model::validate(spec);
    ML_ASSERT_BAD(res);


    // Add target to updatable neural network model (3rd) within pipeline
    std::string softmaxOutputName = "softmax_out";
    std::string targetName = "cce_target";
    (void)addSoftmaxLayer(*m3, "softmax", tensorAttributesD.name, softmaxOutputName.c_str());

    Specification::NetworkUpdateParameters *updateParams = neuralNet->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name("cce_loss");
    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input(softmaxOutputName);
    ceLossLayer->set_target(targetName);

    auto trainingInput = (*m3).mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(targetName);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    res = Model::validate(*m3);
    ML_ASSERT_GOOD(res);

    return 0;
}